

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

char * comm_bit_name(long *comm_flags)

{
  ulong uVar1;
  char *pcVar2;
  ulong *in_RDI;
  __type_conflict2 _Var3;
  
  comm_bit_name::buf[0] = '\0';
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd815);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," quiet");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd860);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," deaf");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd8a8);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_wiz");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd8f3);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_auction");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd93b);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_gossip");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd980);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_question");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fd9c5);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_newbie");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fda0a);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_quote");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fda4f);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," compact");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fda94);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," brief");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdad9);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," prompt");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdb1e);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," combine");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdb63);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_emote");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdba8);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_shout");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdbed);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_tell");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdc32);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," no_channels");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdc77);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," color");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdcbc);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," switchskills");
  }
  uVar1 = *in_RDI;
  _Var3 = std::pow<int,int>(0,0x5fdd01);
  if ((uVar1 & (long)_Var3) != 0) {
    strcat(comm_bit_name::buf," lots o color!");
  }
  pcVar2 = " none";
  if (comm_bit_name::buf[0] != '\0') {
    pcVar2 = comm_bit_name::buf;
  }
  return pcVar2 + 1;
}

Assistant:

char *comm_bit_name(long comm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(comm_flags, COMM_QUIET))
		strcat(buf, " quiet");

	if (IS_SET(comm_flags, COMM_DEAF))
		strcat(buf, " deaf");

	if (IS_SET(comm_flags, COMM_NOWIZ))
		strcat(buf, " no_wiz");

	if (IS_SET(comm_flags, COMM_NOAUCTION))
		strcat(buf, " no_auction");

	if (IS_SET(comm_flags, COMM_NOGOSSIP))
		strcat(buf, " no_gossip");

	if (IS_SET(comm_flags, COMM_NOQUESTION))
		strcat(buf, " no_question");

	if (IS_SET(comm_flags, COMM_NONEWBIE))
		strcat(buf, " no_newbie");

	if (IS_SET(comm_flags, COMM_NOQUOTE))
		strcat(buf, " no_quote");

	if (IS_SET(comm_flags, COMM_COMPACT))
		strcat(buf, " compact");

	if (IS_SET(comm_flags, COMM_BRIEF))
		strcat(buf, " brief");

	if (IS_SET(comm_flags, COMM_PROMPT))
		strcat(buf, " prompt");

	if (IS_SET(comm_flags, COMM_COMBINE))
		strcat(buf, " combine");

	if (IS_SET(comm_flags, COMM_NOEMOTE))
		strcat(buf, " no_emote");

	if (IS_SET(comm_flags, COMM_NOSHOUT))
		strcat(buf, " no_shout");

	if (IS_SET(comm_flags, COMM_NOTELL))
		strcat(buf, " no_tell");

	if (IS_SET(comm_flags, COMM_NOCHANNELS))
		strcat(buf, " no_channels");

	if (IS_SET(comm_flags, COMM_ANSI))
		strcat(buf, " color");

	if (IS_SET(comm_flags, COMM_SWITCHSKILLS))
		strcat(buf, " switchskills");

	if (IS_SET(comm_flags, COMM_LOTS_O_COLOR))
		strcat(buf, " lots o color!");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}